

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XlearnDataFree(DataHandle *out)

{
  DMatrix *this;
  ostream *poVar1;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  if (out != (DataHandle *)0x0) {
    xLearn::DMatrix::Reset((DMatrix *)*out);
    this = (DMatrix *)*out;
    if (this != (DMatrix *)0x0) {
      xLearn::DMatrix::~DMatrix(this);
    }
    operator_delete(this);
    return 0;
  }
  local_54.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/c_api/c_api.cc"
             ,&local_55);
  std::__cxx11::string::string((string *)&local_50,"XlearnDataFree",&local_56);
  poVar1 = Logger::Start(ERR,&local_30,0x87,&local_50);
  poVar1 = std::operator<<(poVar1,"CHECK failed ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/c_api/c_api.cc"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x87);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"out");
  std::operator<<(poVar1," == NULL \n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  Logger::~Logger(&local_54);
  abort();
}

Assistant:

XL_DLL int XlearnDataFree(DataHandle* out) {
  API_BEGIN();
  CHECK_NOTNULL(out);
  reinterpret_cast<xLearn::DMatrix*>(*out)->Reset();
  delete reinterpret_cast<xLearn::DMatrix*>(*out);
  API_END();
}